

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textrender.cpp
# Opt level: O0

float __thiscall CTextRender::TextWidth(CTextRender *this,float FontSize,char *pText,int Length)

{
  int iVar1;
  undefined4 in_EDX;
  undefined8 in_RSI;
  long *in_RDI;
  float in_XMM0_Da;
  CTextCursor *in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffe0;
  
  if (TextWidth(float,char_const*,int)::s_Cursor == '\0') {
    iVar1 = __cxa_guard_acquire(&TextWidth(float,char_const*,int)::s_Cursor);
    if (iVar1 != 0) {
      CTextCursor::CTextCursor((CTextCursor *)CONCAT44(in_EDX,in_stack_ffffffffffffffe0));
      __cxa_atexit(CTextCursor::~CTextCursor,&TextWidth::s_Cursor,&__dso_handle);
      __cxa_guard_release(&TextWidth(float,char_const*,int)::s_Cursor);
    }
  }
  TextWidth::s_Cursor.m_Flags = 1;
  TextWidth::s_Cursor.m_FontSize = in_XMM0_Da;
  CTextCursor::Reset(in_stack_ffffffffffffffd0,(int64)in_RDI);
  (**(code **)(*in_RDI + 0x38))(in_RDI,&TextWidth::s_Cursor,in_RSI,in_EDX);
  return TextWidth::s_Cursor.m_Width;
}

Assistant:

float CTextRender::TextWidth(float FontSize, const char *pText, int Length)
{
	static CTextCursor s_Cursor;
	s_Cursor.m_FontSize = FontSize;
	s_Cursor.m_Flags = TEXTFLAG_NO_RENDER;
	s_Cursor.Reset();
	TextDeferred(&s_Cursor, pText, Length);
	return s_Cursor.m_Width;
}